

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_extract_tokens(NGP_RAW_LINE *cl)

{
  char **ppcVar1;
  byte bVar2;
  char cVar3;
  int iVar4;
  long lVar5;
  byte *pbVar6;
  byte *pbVar7;
  bool bVar8;
  char *pcVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  pcVar9 = cl->line;
  if (pcVar9 == (char *)0x0) {
    return 0x16a;
  }
  cl->comment = (char *)0x0;
  ppcVar1 = &cl->name;
  lVar5 = 0;
  cl->format = 0;
  cl->name = (char *)0x0;
  cl->value = (char *)0x0;
  cl->type = 0;
  do {
    bVar2 = pcVar9[lVar5];
    if (bVar2 < 10) {
      if (bVar2 != 9) {
        if (bVar2 != 0) {
LAB_001bdf0d:
          pbVar10 = (byte *)(pcVar9 + lVar5);
          *ppcVar1 = (char *)pbVar10;
          bVar8 = false;
          break;
        }
LAB_001bdef5:
        *pcVar9 = '\0';
        cl->name = cl->line;
        cl->comment = cl->line;
        goto LAB_001be0a8;
      }
    }
    else if (bVar2 != 0x20) {
      if (bVar2 == 10) goto LAB_001bdef5;
      goto LAB_001bdf0d;
    }
    if ((int)lVar5 == 7) goto LAB_001bdec2;
    lVar5 = lVar5 + 1;
  } while( true );
LAB_001bdf23:
  if ((*pbVar10 == 10) || (*pbVar10 == 0)) goto LAB_001bdf76;
  iVar4 = fits_strncasecmp("HIERARCH",(char *)pbVar10,8);
  if ((iVar4 == 0) && (pbVar6 = (byte *)strchr((char *)pbVar10,0x3d), pbVar6 != (byte *)0x0)) {
    bVar8 = true;
    pbVar10 = pbVar6;
    goto LAB_001bdf81;
  }
  bVar2 = *pbVar10;
  if ((bVar2 == 9) || (bVar2 == 0x20)) goto LAB_001bdf81;
  if (bVar2 == 0x3d) {
    bVar8 = true;
    goto LAB_001bdf81;
  }
  pbVar10 = pbVar10 + 1;
  goto LAB_001bdf23;
LAB_001be01f:
  if (bVar2 == 0x27) {
    cl->value = (char *)pbVar10;
    cl->type = 2;
    pbVar6 = pbVar10;
    do {
      bVar2 = *pbVar10;
      pbVar11 = pbVar10;
      if (bVar2 == 0x27) {
        pbVar7 = pbVar10 + 1;
        bVar2 = pbVar10[1];
        if (bVar2 < 0x20) {
          if (bVar2 == 0) goto LAB_001be14f;
          if (bVar2 == 9) goto LAB_001be15b;
          if (bVar2 == 10) goto LAB_001be14f;
        }
        else {
          pbVar11 = pbVar7;
          if ((bVar2 != 0x27) && (pbVar11 = pbVar10, bVar2 == 0x20)) goto LAB_001be15b;
        }
      }
      else if ((bVar2 == 10) || (bVar2 == 0)) goto LAB_001be14f;
      pbVar10 = pbVar11 + 1;
      *pbVar6 = *pbVar11;
      pbVar6 = pbVar6 + 1;
    } while( true );
  }
  if (bVar2 == 0x2f) {
    if ((*pbVar10 == 9) || (*pbVar10 == 0x20)) {
      pbVar10 = pbVar6 + 2;
    }
    cl->comment = (char *)pbVar10;
    do {
      if (*pbVar10 == 10) {
        *pbVar10 = 0;
      }
      bVar2 = *pbVar10;
      pbVar10 = pbVar10 + 1;
    } while (bVar2 != 0);
    return 0;
  }
  cl->value = (char *)pbVar6;
  cl->type = 0;
  do {
    bVar2 = *pbVar6;
    if (bVar2 < 10) {
      if (bVar2 == 0) {
LAB_001be14f:
        *pbVar6 = 0;
        return 0;
      }
      if (bVar2 == 9) break;
    }
    else {
      if (bVar2 == 0x20) break;
      if (bVar2 == 10) goto LAB_001be14f;
    }
    pbVar6 = pbVar6 + 1;
  } while( true );
  pbVar7 = pbVar6 + 1;
LAB_001be15b:
  *pbVar6 = 0;
  do {
    while( true ) {
      pbVar10 = pbVar7;
      pbVar7 = pbVar10 + 1;
      bVar2 = *pbVar10;
      if (9 < bVar2) break;
      if (bVar2 != 9) {
        if (bVar2 == 0) {
          return 0;
        }
LAB_001be1b7:
        cl->format = 1;
        return 0;
      }
    }
  } while (bVar2 == 0x20);
  if (bVar2 == 10) {
    return 0;
  }
  if (bVar2 == 0x2f) {
    if ((*pbVar7 == 9) || (*pbVar7 == 0x20)) {
      pbVar7 = pbVar10 + 2;
    }
    cl->comment = (char *)pbVar7;
    do {
      if (*pbVar7 == 10) {
        *pbVar7 = 0;
      }
      bVar2 = *pbVar7;
      pbVar7 = pbVar7 + 1;
    } while (bVar2 != 0);
    return 0;
  }
  goto LAB_001be1b7;
LAB_001bdec2:
  pcVar9 = pcVar9 + 8;
  cl->comment = pcVar9;
  do {
    if (*pcVar9 == '\n') {
      *pcVar9 = '\0';
    }
    cVar3 = *pcVar9;
    pcVar9 = pcVar9 + 1;
  } while (cVar3 != '\0');
  *cl->line = '\0';
  cl->name = cl->line;
  goto LAB_001be0a8;
LAB_001bdf76:
  *pbVar10 = 0;
LAB_001bdf81:
  if (*pbVar10 != 0) {
    *pbVar10 = 0;
    pbVar10 = pbVar10 + 1;
  }
  iVar4 = fits_strcasecmp("HISTORY",*ppcVar1);
  if (((iVar4 != 0) && (iVar4 = fits_strcasecmp("COMMENT",*ppcVar1), iVar4 != 0)) &&
     (iVar4 = fits_strcasecmp("CONTINUE",*ppcVar1), iVar4 != 0)) {
    iVar4 = fits_strcasecmp("\\INCLUDE",*ppcVar1);
    if (iVar4 == 0) {
      for (; (*pbVar10 == 0x20 || (*pbVar10 == 9)); pbVar10 = pbVar10 + 1) {
      }
      cl->value = (char *)pbVar10;
      do {
        if (*pbVar10 == 10) {
          *pbVar10 = 0;
        }
        bVar2 = *pbVar10;
        pbVar10 = pbVar10 + 1;
      } while (bVar2 != 0);
      cl->type = 0;
      return 0;
    }
LAB_001bdfea:
    do {
      pbVar6 = pbVar10;
      pbVar10 = pbVar6 + 1;
      bVar2 = *pbVar6;
      if (bVar2 < 10) {
        if (bVar2 == 9) goto LAB_001bdfea;
        if (bVar2 == 0) {
          return 0;
        }
      }
      else {
        if (bVar2 == 0x20) goto LAB_001bdfea;
        if (bVar2 == 10) {
          return 0;
        }
      }
      if ((bVar8) || (bVar8 = true, bVar2 != 0x3d)) goto LAB_001be01f;
    } while( true );
  }
  cl->comment = (char *)pbVar10;
  do {
    if (*pbVar10 == 10) {
      *pbVar10 = 0;
    }
    bVar2 = *pbVar10;
    pbVar10 = pbVar10 + 1;
  } while (bVar2 != 0);
LAB_001be0a8:
  cl->type = 7;
  return 0;
}

Assistant:

int	ngp_extract_tokens(NGP_RAW_LINE *cl)
 { char *p, *s;
   int	cl_flags, i;

   p = cl->line;				/* start from beginning of line */
   if (NULL == p) return(NGP_NUL_PTR);

   cl->name = cl->value = cl->comment = NULL;
   cl->type = NGP_TTYPE_UNKNOWN;
   cl->format = NGP_FORMAT_OK;

   cl_flags = 0;

   for (i=0;; i++)				/* if 8 spaces at beginning then line is comment */
    { if ((0 == *p) || ('\n' == *p))
        {					/* if line has only blanks -> write blank keyword */
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->comment = cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;		/* signal write unformatted to FITS file */
          return(NGP_OK);
        }
      if ((' ' != *p) && ('\t' != *p)) break;
      if (i >= 7)
        { 
          cl->comment = p + 1;
          for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
           { if ('\n' == *s) *s = 0;
	     if (0 == *s) break;
           }
          cl->line[0] = 0;			/* create empty name (0 length string) */
          cl->name = cl->line;
	  cl->type = NGP_TTYPE_RAW;
          return(NGP_OK);
        }
      p++;
    }

   cl->name = p;

   for (;;)					/* we need to find 1st whitespace */
    { if ((0 == *p) || ('\n' == *p))
        { *p = 0;
          break;
        }

      /*
        from Richard Mathar, 2002-05-03, add 10 lines:
        if upper/lowercase HIERARCH followed also by an equal sign...
      */
      if( fits_strncasecmp("HIERARCH",p,strlen("HIERARCH")) == 0 )
      {
           char * const eqsi=strchr(p,'=') ;
           if( eqsi )
           {
              cl_flags |= NGP_FOUND_EQUAL_SIGN ;
              p=eqsi ;
              break ;
           }
      }

      if ((' ' == *p) || ('\t' == *p)) break;
      if ('=' == *p)
        { cl_flags |= NGP_FOUND_EQUAL_SIGN;
          break;
        }

      p++;
    }

   if (*p) *(p++) = 0;				/* found end of keyname so terminate string with zero */

   if ((!fits_strcasecmp("HISTORY", cl->name))
    || (!fits_strcasecmp("COMMENT", cl->name))
    || (!fits_strcasecmp("CONTINUE", cl->name)))
     { cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_RAW;
       return(NGP_OK);
     }

   if (!fits_strcasecmp("\\INCLUDE", cl->name))
     {
       for (;; p++)  if ((' ' != *p) && ('\t' != *p)) break; /* skip whitespace */

       cl->value = p;
       for (s = cl->value;; s++)		/* filter out any EOS characters */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       cl->type = NGP_TTYPE_UNKNOWN;
       return(NGP_OK);
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' == *p) || ('\t' == *p)) continue; /* skip whitespace */
      if (cl_flags & NGP_FOUND_EQUAL_SIGN) break;
      if ('=' != *p) break;			/* ignore initial equal sign */
      cl_flags |= NGP_FOUND_EQUAL_SIGN;
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   if ('\'' == *p)				/* we have found string within quotes */
     { cl->value = s = ++p;			/* set pointer to beginning of that string */
       cl->type = NGP_TTYPE_STRING;		/* signal that it is of string type */

       for (;;)					/* analyze it */
        { if ((0 == *p) || ('\n' == *p))	/* end of line -> end of string */
            { *s = 0; return(NGP_OK); }

          if ('\'' == *p)			/* we have found doublequote */
            { if ((0 == p[1]) || ('\n' == p[1]))/* doublequote is the last character in line */
                { *s = 0; return(NGP_OK); }
              if (('\t' == p[1]) || (' ' == p[1])) /* duoblequote was string terminator */
                { *s = 0; p++; break; }
              if ('\'' == p[1]) p++;		/* doublequote is inside string, convert "" -> " */ 
            }

          *(s++) = *(p++);			/* compact string in place, necess. by "" -> " conversion */
        }
     }
   else						/* regular token */
     { 
       cl->value = p;				/* set pointer to token */
       cl->type = NGP_TTYPE_UNKNOWN;		/* we dont know type at the moment */
       for (;; p++)				/* we need to find 1st whitespace */
        { if ((0 == *p) || ('\n' == *p))
            { *p = 0; return(NGP_OK); }
          if ((' ' == *p) || ('\t' == *p)) break;
        }
       if (*p)  *(p++) = 0;			/* found so terminate string with zero */
     }
       
   for (;; p++)
    { if ((0 == *p) || ('\n' == *p))  return(NGP_OK);	/* test if at end of string */
      if ((' ' != *p) && ('\t' != *p)) break;	/* skip whitespace */
    }
      
   if ('/' == *p)				/* no value specified, comment only */
     { p++;
       if ((' ' == *p) || ('\t' == *p)) p++;
       cl->comment = p;
       for (s = cl->comment;; s++)		/* filter out any EOS characters in comment */
        { if ('\n' == *s) *s = 0;
	  if (0 == *s) break;
        }
       return(NGP_OK);
     }

   cl->format = NGP_FORMAT_ERROR;
   return(NGP_OK);				/* too many tokens ... */
 }